

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O1

nhdp_domain * nhdp_domain_add(uint8_t ext)

{
  int *piVar1;
  list_entity **pplVar2;
  int iVar3;
  list_entity *plVar4;
  nhdp_domain *pnVar5;
  rfc5444_writer_tlvtype *prVar6;
  long lVar7;
  
  plVar4 = &_domain_list;
  pnVar5 = (nhdp_domain *)0x0;
  do {
    plVar4 = plVar4->next;
    if (plVar4->prev == _domain_list.prev) goto LAB_00128f32;
  } while (*(uint8_t *)((long)&plVar4[-0x27].next + 1) != ext);
  pnVar5 = (nhdp_domain *)(plVar4 + -0x2a);
LAB_00128f32:
  if (pnVar5 == (nhdp_domain *)0x0) {
    if (_domain_counter == 4) {
      if (((&log_global_mask)[LOG_NHDP] & 4) != 0) {
        oonf_log(4,(ulong)LOG_NHDP,"src/nhdp/nhdp/nhdp_domain.c",0x44d,0,0,
                 "Maximum number of NHDP domains reached: %d",4);
        return (nhdp_domain *)0x0;
      }
    }
    else {
      pnVar5 = (nhdp_domain *)oonf_class_malloc(&_domain_class);
      if (pnVar5 != (nhdp_domain *)0x0) {
        pnVar5->ext = ext;
        iVar3 = (int)_domain_counter;
        _domain_counter = _domain_counter + 1;
        pnVar5->index = iVar3;
        pnVar5->metric = &_no_metric;
        pnVar5->mpr = &_everyone_mprs;
        _everyone_mprs._refcount = _everyone_mprs._refcount + 1;
        piVar1 = &pnVar5->metric->_refcount;
        *piVar1 = *piVar1 + 1;
        prVar6 = pnVar5->_metric_addrtlvs;
        lVar7 = 4;
        do {
          prVar6->type = '\a';
          prVar6->exttype = pnVar5->ext;
          rfc5444_writer_register_addrtlvtype(&_protocol->writer,prVar6,0xffffffff);
          prVar6 = prVar6 + 1;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
        (pnVar5->_node).next = &_domain_list;
        (pnVar5->_node).prev = _domain_list.prev;
        pplVar2 = &(_domain_list.prev)->next;
        _domain_list.prev = &pnVar5->_node;
        *pplVar2 = &pnVar5->_node;
        oonf_class_event(&_domain_class,pnVar5,OONF_OBJECT_ADDED);
        return pnVar5;
      }
    }
    pnVar5 = (nhdp_domain *)0x0;
  }
  return pnVar5;
}

Assistant:

struct nhdp_domain *
nhdp_domain_add(uint8_t ext) {
  struct nhdp_domain *domain;
  int i;

  domain = nhdp_domain_get_by_ext(ext);
  if (domain) {
    return domain;
  }

  if (_domain_counter == NHDP_MAXIMUM_DOMAINS) {
    OONF_WARN(LOG_NHDP, "Maximum number of NHDP domains reached: %d", NHDP_MAXIMUM_DOMAINS);
    return NULL;
  }

  /* initialize new domain */
  domain = oonf_class_malloc(&_domain_class);
  if (domain == NULL) {
    return NULL;
  }

  domain->ext = ext;
  domain->index = _domain_counter++;
  domain->metric = &_no_metric;
  domain->mpr = &_everyone_mprs;

  domain->mpr->_refcount++;
  domain->metric->_refcount++;

  /* initialize metric TLVs */
  for (i = 0; i < 4; i++) {
    domain->_metric_addrtlvs[i].type = RFC7181_ADDRTLV_LINK_METRIC;
    domain->_metric_addrtlvs[i].exttype = domain->ext;

    rfc5444_writer_register_addrtlvtype(&_protocol->writer, &domain->_metric_addrtlvs[i], -1);
  }

  /* add to domain list */
  list_add_tail(&_domain_list, &domain->_node);

  oonf_class_event(&_domain_class, domain, OONF_OBJECT_ADDED);
  return domain;
}